

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boosting.cc
# Opt level: O1

base_learner * boosting_setup(options_i *options,vw *all)

{
  string *location;
  pointer pfVar1;
  long lVar2;
  int iVar3;
  boosting *dat;
  option_group_definition *poVar4;
  typed_option<float> *op;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *op_00;
  long *plVar5;
  ostream *poVar6;
  base_learner *pbVar7;
  single_learner *psVar8;
  learner<boosting,_example> *plVar9;
  code *pcVar10;
  vw_exception *this;
  size_type __dnew_2;
  option_group_definition new_options;
  size_type __dnew_1;
  stringstream __msg;
  size_type __dnew;
  long *local_468;
  long local_460;
  long local_458 [2];
  _func_int ***local_448;
  _func_int **local_440;
  _func_int **local_438 [2];
  pointer *local_428;
  pointer local_420;
  pointer local_418 [2];
  long local_408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  option_group_definition local_380;
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 local_338;
  undefined1 local_330;
  string local_328;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_308;
  undefined1 local_268 [16];
  undefined1 local_258 [32];
  string local_238 [64];
  bool local_1f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1d0;
  typed_option<float> local_d8;
  
  dat = calloc_or_throw<boosting>(1);
  dat->N = 0;
  dat->gamma = 0.0;
  (dat->alg)._M_dataplus._M_p = (pointer)0x0;
  (dat->alg)._M_string_length = 0;
  (dat->alg).field_2._M_allocated_capacity = 0;
  (dat->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&dat->t = 0;
  *(undefined8 *)((long)&(dat->alg).field_2 + 8) = 0;
  dat->all = (vw *)0x0;
  (dat->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (dat->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (dat->C).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (dat->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (dat->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (dat->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (dat->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (dat->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (dat->alg)._M_dataplus._M_p = (pointer)&(dat->alg).field_2;
  (dat->alg)._M_string_length = 0;
  (dat->alg).field_2._M_local_buf[0] = '\0';
  (dat->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_338 = 0x676e6974736f6f42;
  local_340 = 8;
  local_330 = 0;
  local_380.m_name._M_dataplus._M_p = (pointer)&local_380.m_name.field_2;
  local_348 = &local_338;
  std::__cxx11::string::_M_construct<char*>((string *)&local_380,&local_338);
  local_380.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_380.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_380.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_348 != &local_338) {
    operator_delete(local_348);
  }
  local_3a0._M_dataplus._M_p = (pointer)&local_3a0.field_2;
  local_3a0.field_2._M_allocated_capacity = 0x676e6974736f6f62;
  local_3a0._M_string_length = 8;
  local_3a0.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<int>::typed_option((typed_option<int> *)local_268,&local_3a0,&dat->N);
  local_1f8 = true;
  local_428 = local_418;
  local_d8.super_base_option._vptr_base_option = (_func_int **)0x26;
  local_428 = (pointer *)std::__cxx11::string::_M_create((ulong *)&local_428,(ulong)&local_d8);
  local_418[0] = (pointer)local_d8.super_base_option._vptr_base_option;
  local_428[2] = (pointer)0x3e4e3c2068746977;
  local_428[3] = (pointer)0x656c206b61657720;
  *local_428 = (pointer)0x6220656e696c6e4f;
  local_428[1] = (pointer)0x20676e6974736f6f;
  builtin_strncpy((char *)((long)local_428 + 0x1e),"learners",8);
  local_420 = (pointer)local_d8.super_base_option._vptr_base_option;
  *(char *)((long)local_428 + (long)local_d8.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign(local_238);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<int>&>
                     (&local_380,(typed_option<int> *)local_268);
  local_3c0._M_dataplus._M_p = (pointer)&local_3c0.field_2;
  local_3c0.field_2._M_allocated_capacity._0_4_ = 0x6d6d6167;
  local_3c0.field_2._M_allocated_capacity._4_2_ = 0x61;
  local_3c0._M_string_length = 5;
  VW::config::typed_option<float>::typed_option(&local_d8,&local_3c0,&dat->gamma);
  op = VW::config::typed_option<float>::default_value(&local_d8,0.1);
  local_448 = local_438;
  local_308.super_base_option._vptr_base_option = (_func_int **)0x33;
  local_448 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_448,(ulong)&local_308);
  local_438[0] = local_308.super_base_option._vptr_base_option;
  local_448[4] = (_func_int **)0x796220796c6e6f20;
  local_448[5] = (_func_int **)0x20656e696c6e6f20;
  local_448[2] = (_func_int **)0x2e303d2820656764;
  local_448[3] = (_func_int **)0x64657375202c2931;
  *local_448 = (_func_int **)0x61656c206b616577;
  local_448[1] = (_func_int **)0x6520732772656e72;
  builtin_strncpy((char *)((long)local_448 + 0x2f)," BBM",4);
  local_440 = local_308.super_base_option._vptr_base_option;
  *(char *)((long)local_448 + (long)local_308.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(op->super_base_option).m_help);
  poVar4 = VW::config::option_group_definition::add<VW::config::typed_option<float>&>(poVar4,op);
  location = &dat->alg;
  local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
  local_3e0.field_2._M_allocated_capacity._0_4_ = 0x676c61;
  local_3e0._M_string_length = 3;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_308,&local_3e0,location);
  local_308.super_base_option.m_keep = true;
  local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
  local_400.field_2._M_allocated_capacity._0_4_ = 0x4d4242;
  local_400._M_string_length = 3;
  op_00 = VW::config::
          typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::default_value(&local_308,&local_400);
  local_468 = local_458;
  local_408 = 0x5f;
  plVar5 = (long *)std::__cxx11::string::_M_create((ulong *)&local_468,(ulong)&local_408);
  lVar2 = local_408;
  local_458[0] = local_408;
  local_468 = plVar5;
  memcpy(plVar5,
         "specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"
         ,0x5f);
  local_460 = lVar2;
  *(undefined1 *)((long)plVar5 + lVar2) = 0;
  std::__cxx11::string::_M_assign((string *)&(op_00->super_base_option).m_help);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (poVar4,op_00);
  if (local_468 != local_458) {
    operator_delete(local_468);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_400._M_dataplus._M_p != &local_400.field_2) {
    operator_delete(local_400._M_dataplus._M_p);
  }
  local_308.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002e8eb0;
  if (local_308.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_308.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_308.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_308.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
    operator_delete(local_3e0._M_dataplus._M_p);
  }
  if (local_448 != local_438) {
    operator_delete(local_448);
  }
  local_d8.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002e8f58;
  if (local_d8.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d8.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d8.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c0._M_dataplus._M_p != &local_3c0.field_2) {
    operator_delete(local_3c0._M_dataplus._M_p);
  }
  if (local_428 != local_418) {
    operator_delete(local_428);
  }
  local_268._0_8_ = &PTR__typed_option_002e9000;
  if (local_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1d0._M_pi);
  }
  if (local_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1e0._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3a0._M_dataplus._M_p != &local_3a0.field_2) {
    operator_delete(local_3a0._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_380);
  local_258._0_8_ = (pointer)0x676e6974736f6f62;
  local_268._8_8_ = (pointer)0x8;
  local_258[8] = '\0';
  local_268._0_8_ = (pointer)local_258;
  iVar3 = (*options->_vptr_options_i[1])(options,local_268);
  if ((pointer)local_268._0_8_ != (pointer)local_258) {
    operator_delete((void *)local_268._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar9 = (learner<boosting,_example> *)0x0;
  }
  else {
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Number of weak learners = ",0x1a);
      plVar5 = (long *)std::ostream::operator<<(&std::cerr,dat->N);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
    if (all->quiet == false) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Gamma = ",8);
      poVar6 = std::ostream::_M_insert<double>((double)dat->gamma);
      std::ios::widen((char)poVar6->_vptr_basic_ostream[-3] + (char)poVar6);
      std::ostream::put((char)poVar6);
      std::ostream::flush();
    }
    iVar3 = dat->N;
    local_428 = (pointer *)0xffffffffffffffff;
    std::vector<long,_std::allocator<long>_>::vector
              ((vector<long,_std::allocator<long>_> *)&local_308,(long)dat->N,
               (value_type_conflict7 *)&local_428,(allocator_type *)&local_448);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
              *)&local_d8,(long)iVar3,(value_type *)&local_308,(allocator_type *)&local_468);
    local_268._0_8_ =
         (dat->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_268._8_8_ =
         (dat->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_258._0_8_ =
         (dat->C).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (dat->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)local_d8.super_base_option._vptr_base_option;
    (dat->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)local_d8.super_base_option.m_name._M_dataplus._M_p;
    (dat->C).
    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)local_d8.super_base_option.m_name._M_string_length;
    local_d8.super_base_option._vptr_base_option = (_func_int **)0x0;
    local_d8.super_base_option.m_name._M_dataplus._M_p = (pointer)0x0;
    local_d8.super_base_option.m_name._M_string_length = 0;
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)local_268);
    std::
    vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
    ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
               *)&local_d8);
    if (local_308.super_base_option._vptr_base_option != (_func_int **)0x0) {
      operator_delete(local_308.super_base_option._vptr_base_option);
    }
    dat->t = 0;
    dat->all = all;
    local_d8.super_base_option._vptr_base_option =
         (_func_int **)((ulong)local_d8.super_base_option._vptr_base_option & 0xffffffff00000000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_268,(long)dat->N,
               (value_type_conflict5 *)&local_d8,(allocator_type *)&local_308);
    pfVar1 = (dat->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (dat->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_268._0_8_;
    (dat->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_268._8_8_;
    (dat->alpha).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_258._0_8_;
    local_268._0_8_ = (pointer)0x0;
    local_268._8_8_ = (pointer)0x0;
    local_258._0_8_ = (pointer)0x0;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1);
    }
    if ((pointer)local_268._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_268._0_8_);
    }
    local_d8.super_base_option._vptr_base_option =
         (_func_int **)CONCAT44(local_d8.super_base_option._vptr_base_option._4_4_,0x3f800000);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_268,(long)dat->N,
               (value_type_conflict5 *)&local_d8,(allocator_type *)&local_308);
    pfVar1 = (dat->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    (dat->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)local_268._0_8_;
    (dat->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)local_268._8_8_;
    (dat->v).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)local_258._0_8_;
    local_268._0_8_ = (pointer)0x0;
    local_268._8_8_ = (pointer)0x0;
    local_258._0_8_ = (pointer)0x0;
    if (pfVar1 != (pointer)0x0) {
      operator_delete(pfVar1);
    }
    if ((pointer)local_268._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_268._0_8_);
    }
    iVar3 = std::__cxx11::string::compare((char *)location);
    if (iVar3 == 0) {
      pbVar7 = setup_base(options,all);
      psVar8 = LEARNER::as_singleline<char,char>(pbVar7);
      plVar9 = LEARNER::learner<boosting,example>::init_learner<LEARNER::learner<char,example>>
                         (dat,psVar8,predict_or_learn<true>,predict_or_learn<false>,(long)dat->N,
                          *(prediction_type_t *)(psVar8 + 0xd0));
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)location);
      if (iVar3 == 0) {
        pbVar7 = setup_base(options,all);
        psVar8 = LEARNER::as_singleline<char,char>(pbVar7);
        plVar9 = LEARNER::learner<boosting,example>::init_learner<LEARNER::learner<char,example>>
                           (dat,psVar8,predict_or_learn_logistic<true>,
                            predict_or_learn_logistic<false>,(long)dat->N,
                            *(prediction_type_t *)(psVar8 + 0xd0));
        pcVar10 = save_load;
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)location);
        if (iVar3 != 0) {
          std::__cxx11::stringstream::stringstream((stringstream *)local_268);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_258,"Unrecognized boosting algorithm: \'",0x22);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_258,(dat->alg)._M_dataplus._M_p,
                              (dat->alg)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\' Bailing!",10);
          this = (vw_exception *)__cxa_allocate_exception(0x38);
          std::__cxx11::stringbuf::str();
          VW::vw_exception::vw_exception
                    (this,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LAIRLAB[P]vowpal_wabbit/vowpalwabbit/boosting.cc"
                     ,0x1c3,&local_328);
          __cxa_throw(this,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
        }
        pbVar7 = setup_base(options,all);
        psVar8 = LEARNER::as_singleline<char,char>(pbVar7);
        plVar9 = LEARNER::learner<boosting,example>::init_learner<LEARNER::learner<char,example>>
                           (dat,psVar8,predict_or_learn_adaptive<true>,
                            predict_or_learn_adaptive<false>,(long)dat->N,
                            *(prediction_type_t *)(psVar8 + 0xd0));
        pcVar10 = save_load_sampling;
      }
      *(code **)(plVar9 + 0x80) = pcVar10;
      *(undefined8 *)(plVar9 + 0x70) = *(undefined8 *)(plVar9 + 0x18);
      *(undefined8 *)(plVar9 + 0x78) = *(undefined8 *)(plVar9 + 0x20);
    }
    *(undefined8 *)(plVar9 + 0xb8) = *(undefined8 *)(plVar9 + 0x18);
    *(undefined8 *)(plVar9 + 0xc0) = *(undefined8 *)(plVar9 + 0x20);
    *(code **)(plVar9 + 200) = finish;
    *(undefined8 *)(plVar9 + 0x58) = *(undefined8 *)(plVar9 + 0x18);
    *(code **)(plVar9 + 0x68) = return_example;
    dat = (boosting *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_380.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380.m_name._M_dataplus._M_p != &local_380.m_name.field_2) {
    operator_delete(local_380.m_name._M_dataplus._M_p);
  }
  if (dat != (boosting *)0x0) {
    destroy_free<boosting>(dat);
  }
  return (base_learner *)plVar9;
}

Assistant:

LEARNER::base_learner* boosting_setup(options_i& options, vw& all)
{
  free_ptr<boosting> data = scoped_calloc_or_throw<boosting>();
  option_group_definition new_options("Boosting");
  new_options.add(make_option("boosting", data->N).keep().help("Online boosting with <N> weak learners"))
      .add(make_option("gamma", data->gamma)
               .default_value(0.1f)
               .help("weak learner's edge (=0.1), used only by online BBM"))
      .add(
          make_option("alg", data->alg)
              .keep()
              .default_value("BBM")
              .help("specify the boosting algorithm: BBM (default), logistic (AdaBoost.OL.W), adaptive (AdaBoost.OL)"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("boosting"))
    return nullptr;

  // Description of options:
  // "BBM" implements online BBM (Algorithm 1 in BLK'15)
  // "logistic" implements AdaBoost.OL.W (importance weighted version
  // 	    of Algorithm 2 in BLK'15)
  // "adaptive" implements AdaBoost.OL (Algorithm 2 in BLK'15,
  // 	    using sampling rather than importance weighting)

  if (!all.quiet)
    cerr << "Number of weak learners = " << data->N << endl;
  if (!all.quiet)
    cerr << "Gamma = " << data->gamma << endl;

  data->C = std::vector<std::vector<int64_t> >(data->N, std::vector<int64_t>(data->N, -1));
  data->t = 0;
  data->all = &all;
  data->alpha = std::vector<float>(data->N, 0);
  data->v = std::vector<float>(data->N, 1);

  learner<boosting, example>* l;
  if (data->alg == "BBM")
    l = &init_learner<boosting, example>(
        data, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>, data->N);
  else if (data->alg == "logistic")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_logistic<true>,
        predict_or_learn_logistic<false>, data->N);
    l->set_save_load(save_load);
  }
  else if (data->alg == "adaptive")
  {
    l = &init_learner<boosting, example>(data, as_singleline(setup_base(options, all)), predict_or_learn_adaptive<true>,
        predict_or_learn_adaptive<false>, data->N);
    l->set_save_load(save_load_sampling);
  }
  else
    THROW("Unrecognized boosting algorithm: \'" << data->alg << "\' Bailing!");

  l->set_finish(finish);
  l->set_finish_example(return_example);

  return make_base(*l);
}